

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cc
# Opt level: O2

void __thiscall dnet::nn::relu::relu(relu *this,axes_type *input_shape)

{
  uint __val;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->super_activation).super_op.id._M_dataplus._M_p =
       (pointer)&(this->super_activation).super_op.id.field_2;
  (this->super_activation).super_op.id._M_string_length = 0;
  (this->super_activation).super_op.id.field_2._M_local_buf[0] = '\0';
  (this->super_activation).super_op._vptr_op = (_func_int **)&PTR_forwardp_00144a00;
  data_types::matrix::matrix(&this->_prev_x,input_shape);
  *(undefined8 *)(this->super_activation).super_op.input_shape._M_elems =
       *(undefined8 *)input_shape->_M_elems;
  *(undefined8 *)(this->super_activation).super_op.output_shape._M_elems =
       *(undefined8 *)input_shape->_M_elems;
  __val = misc::rand_int(100000);
  std::__cxx11::to_string(&sStack_58,__val);
  std::operator+(&local_38,"ReLU_",&sStack_58);
  std::__cxx11::string::operator=
            ((string *)&(this->super_activation).super_op.id,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

relu::relu(const tensor<double, 2>::axes_type &input_shape)
            : _prev_x(input_shape), activation(input_shape)
        {
            this->input_shape = input_shape;
            this->output_shape = input_shape;
            this->id = "ReLU_" + std::to_string(dnet::misc::rand_int(100000));
        }